

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O3

shared_ptr<helics::Broker>
helics::BrokerFactory::create(CoreType type,string_view brokerName,string_view configureString)

{
  element_type *peVar1;
  bool bVar2;
  HelicsException *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  char *pcVar4;
  CoreType type_00;
  size_t sVar5;
  undefined4 in_register_0000003c;
  shared_ptr<helics::Broker> *broker;
  string_view name;
  string_view message;
  shared_ptr<helics::Broker> sVar6;
  string newName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  broker = (shared_ptr<helics::Broker> *)CONCAT44(in_register_0000003c,type);
  pcVar4 = brokerName._M_str;
  type_00 = (CoreType)brokerName._M_len;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  if ((type_00 == EXTRACT) || (pcVar4 == (char *)0x0)) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78);
    helics::core::extractCoreType(&local_58,&local_78);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_98,&local_58.second);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.second._M_dataplus._M_p != &local_58.second.field_2) {
      operator_delete(local_58.second._M_dataplus._M_p,
                      local_58.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)local_98._M_string_length;
    }
    if (type_00 == EXTRACT) {
      type_00 = local_58.first;
    }
  }
  name._M_len = (ulong)type_00;
  name._M_str = pcVar4;
  makeBroker(type,name);
  peVar1 = (broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    this = (HelicsException *)__cxa_allocate_exception(0x28);
    pcVar4 = "unable to create broker";
    sVar5 = 0x17;
  }
  else {
    (*peVar1->_vptr_Broker[8])(peVar1,configureString._M_str);
    bVar2 = registerBroker(broker,type_00);
    if (bVar2) {
      (*((broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        _vptr_Broker[2])();
      _Var3._M_pi = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,
                        CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                 local_98.field_2._M_local_buf[0]) + 1);
        _Var3._M_pi = extraout_RDX_00;
      }
      sVar6.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var3._M_pi;
      sVar6.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)broker;
      return (shared_ptr<helics::Broker>)
             sVar6.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
    }
    this = (HelicsException *)__cxa_allocate_exception(0x28);
    pcVar4 = "unable to register broker";
    sVar5 = 0x19;
  }
  message._M_str = pcVar4;
  message._M_len = sVar5;
  HelicsException::HelicsException(this,message);
  *(undefined ***)this = &PTR__HelicsException_004ba9e0;
  __cxa_throw(this,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
}

Assistant:

std::shared_ptr<Broker>
    create(CoreType type, std::string_view brokerName, std::string_view configureString)
{
    std::string newName;
    CoreType newType;
    if (type == CoreType::EXTRACT || brokerName.empty()) {
        std::tie(newType, newName) = core::extractCoreType(std::string{configureString});
        if (brokerName.empty() && !newName.empty()) {
            brokerName = newName;
        }
        if (type == CoreType::EXTRACT) {
            type = newType;
        }
    }
    auto broker = makeBroker(type, brokerName);
    if (!broker) {
        throw(helics::RegistrationFailure("unable to create broker"));
    }
    broker->configure(configureString);
    if (!registerBroker(broker, type)) {
        throw(helics::RegistrationFailure("unable to register broker"));
    }
    broker->connect();
    return broker;
}